

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printc.cc
# Opt level: O2

void __thiscall
PrintC::buildTypeStack
          (PrintC *this,Datatype *ct,
          vector<const_Datatype_*,_std::allocator<const_Datatype_*>_> *typestack)

{
  type_metatype tVar1;
  Datatype *local_20;
  
  local_20 = ct;
  do {
    while( true ) {
      std::vector<const_Datatype_*,_std::allocator<const_Datatype_*>_>::push_back
                (typestack,&local_20);
      if ((local_20->name)._M_string_length != 0) {
        return;
      }
      tVar1 = local_20->metatype;
      if (tVar1 != TYPE_ARRAY) break;
LAB_00325c94:
      local_20 = (Datatype *)local_20[1]._vptr_Datatype;
    }
    if (tVar1 != TYPE_CODE) {
      if (tVar1 != TYPE_PTR) {
        return;
      }
      goto LAB_00325c94;
    }
    if ((FuncProto *)local_20[1]._vptr_Datatype == (FuncProto *)0x0) {
      local_20 = &TypeFactory::getTypeVoid(((this->super_PrintLanguage).glb)->types)->super_Datatype
      ;
    }
    else {
      local_20 = FuncProto::getOutputType((FuncProto *)local_20[1]._vptr_Datatype);
    }
  } while( true );
}

Assistant:

void PrintC::buildTypeStack(const Datatype *ct,vector<const Datatype *> &typestack)

{
  for(;;) {
    typestack.push_back(ct);
    if (ct->getName().size() != 0)	// This can be a base type
      break;
    if (ct->getMetatype()==TYPE_PTR)
      ct = ((TypePointer *)ct)->getPtrTo();
    else if (ct->getMetatype()==TYPE_ARRAY)
      ct = ((TypeArray *)ct)->getBase();
    else if (ct->getMetatype()==TYPE_CODE) {
      const FuncProto *proto = ((TypeCode *)ct)->getPrototype();
      if (proto != (const FuncProto *)0)
	ct = proto->getOutputType();
      else
	ct = glb->types->getTypeVoid();
    }
    else
      break;			// Some other anonymous type
  }
}